

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

int xmlStrcasecmp(xmlChar *str1,xmlChar *str2)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  
  if (str1 == str2) {
    return 0;
  }
  if (str1 == (xmlChar *)0x0) {
    iVar2 = -1;
  }
  else {
    if (str2 != (xmlChar *)0x0) {
      lVar3 = 0;
      do {
        pbVar1 = str2 + lVar3;
        if ((uint)""[str1[lVar3]] - (uint)""[*pbVar1] != 0) {
          return (uint)""[str1[lVar3]] - (uint)""[*pbVar1];
        }
        lVar3 = lVar3 + 1;
      } while (*pbVar1 != 0);
      return 0;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
xmlStrcasecmp(const xmlChar *str1, const xmlChar *str2) {
    register int tmp;

    if (str1 == str2) return(0);
    if (str1 == NULL) return(-1);
    if (str2 == NULL) return(1);
    do {
        tmp = casemap[*str1++] - casemap[*str2];
        if (tmp != 0) return(tmp);
    } while (*str2++ != 0);
    return 0;
}